

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O2

MtrNode * Mtr_InitTree(void)

{
  MtrNode *pMVar1;
  
  pMVar1 = Mtr_AllocNode();
  if (pMVar1 != (MtrNode *)0x0) {
    pMVar1->flags = 0;
    pMVar1->parent = (MtrNode *)0x0;
    pMVar1->child = (MtrNode *)0x0;
    pMVar1->elder = (MtrNode *)0x0;
    pMVar1->younger = (MtrNode *)0x0;
  }
  return pMVar1;
}

Assistant:

MtrNode *
Mtr_InitTree(void)
{
    MtrNode *node;

    node = Mtr_AllocNode();
    if (node == NULL) return(NULL);

    node->parent = node->child = node->elder = node->younger = NULL;
    node->flags = 0;

    return(node);

}